

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOut::VersionWrite<chrono::geometry::ChRoundedBox>(ChArchiveOut *this)

{
  unordered_map<std::type_index,_int,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_int>_>_>
  *this_00;
  iterator iVar1;
  mapped_type *pmVar2;
  key_type local_20;
  
  if ((this->super_ChArchive).use_versions == true) {
    if ((this->super_ChArchive).cluster_class_versions != true) {
      (*(this->super_ChArchive)._vptr_ChArchive[0x11])(this,0,&geometry::ChRoundedBox::typeinfo);
      return;
    }
    this_00 = &(this->super_ChArchive).class_versions;
    local_20._M_target = (type_info *)&geometry::ChRoundedBox::typeinfo;
    iVar1 = std::
            _Hashtable<std::type_index,_std::pair<const_std::type_index,_int>,_std::allocator<std::pair<const_std::type_index,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,&local_20);
    if (iVar1.super__Node_iterator_base<std::pair<const_std::type_index,_int>,_false>._M_cur ==
        (__node_type *)0x0) {
      (*(this->super_ChArchive)._vptr_ChArchive[0x11])(this,0,&geometry::ChRoundedBox::typeinfo);
      local_20._M_target = (type_info *)&geometry::ChRoundedBox::typeinfo;
      pmVar2 = std::__detail::
               _Map_base<std::type_index,_std::pair<const_std::type_index,_int>,_std::allocator<std::pair<const_std::type_index,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_int>,_std::allocator<std::pair<const_std::type_index,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_20);
      *pmVar2 = 0;
    }
  }
  return;
}

Assistant:

void VersionWrite() {
          if (!use_versions)
              return;
          if (this->cluster_class_versions) {
              if (this->class_versions.find(std::type_index(typeid(T))) == this->class_versions.end()) {
                this->out_version(chrono::class_factory::ChClassVersion<T>::version, typeid(T));
                this->class_versions[std::type_index(typeid(T))] = chrono::class_factory::ChClassVersion<T>::version;
              } 
          } 
          else {
              this->out_version(chrono::class_factory::ChClassVersion<T>::version, typeid(T));
          }
      }